

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_req_to_h2(dynhds *h2_headers,httpreq *req,Curl_easy *data)

{
  curl_trc_feat *pcVar1;
  ulong uVar2;
  ulong uVar3;
  CURLcode CVar4;
  int iVar5;
  dynhds_entry *pdVar6;
  char *pcVar7;
  size_t sVar8;
  size_t sVar9;
  long lVar10;
  char *__s;
  ulong n;
  
  pcVar7 = req->scheme;
  if (pcVar7 == (char *)0x0) {
    iVar5 = strcmp("CONNECT",req->method);
    if (iVar5 == 0) {
      pcVar7 = (char *)0x0;
    }
    else {
      pcVar7 = Curl_checkheaders(data,":scheme",7);
      if (pcVar7 == (char *)0x0) {
        if (data->conn == (connectdata *)0x0) {
          pcVar7 = "http";
        }
        else {
          pcVar7 = "https";
          if ((data->conn->handler->flags & 1) == 0) {
            pcVar7 = "http";
          }
        }
      }
      else {
        for (pcVar7 = pcVar7 + 8; (*pcVar7 == ' ' || (*pcVar7 == '\t')); pcVar7 = pcVar7 + 1) {
        }
        if (((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
           ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level))
           )) {
          Curl_infof(data,"set pseudo header %s to %s",":scheme",pcVar7);
        }
      }
    }
  }
  __s = req->authority;
  if (__s == (char *)0x0) {
    pdVar6 = Curl_dynhds_get(&req->headers,"Host",4);
    if (pdVar6 == (dynhds_entry *)0x0) {
      __s = (char *)0x0;
    }
    else {
      __s = pdVar6->value;
    }
  }
  Curl_dynhds_reset(h2_headers);
  Curl_dynhds_set_opts(h2_headers,1);
  sVar8 = strlen(req->method);
  CVar4 = Curl_dynhds_add(h2_headers,":method",7,req->method,sVar8);
  if ((CVar4 == CURLE_OK) && (pcVar7 != (char *)0x0)) {
    sVar8 = strlen(pcVar7);
    CVar4 = Curl_dynhds_add(h2_headers,":scheme",7,pcVar7,sVar8);
  }
  if ((CVar4 == CURLE_OK) && (__s != (char *)0x0)) {
    sVar8 = strlen(__s);
    CVar4 = Curl_dynhds_add(h2_headers,":authority",10,__s,sVar8);
  }
  if (CVar4 == CURLE_OK) {
    pcVar7 = req->path;
    if (pcVar7 == (char *)0x0) {
      CVar4 = CURLE_OK;
    }
    else {
      sVar8 = strlen(pcVar7);
      CVar4 = Curl_dynhds_add(h2_headers,":path",5,pcVar7,sVar8);
    }
  }
  n = 0;
  do {
    if ((CVar4 != CURLE_OK) || (sVar9 = Curl_dynhds_count(&req->headers), sVar9 <= n)) {
      return CVar4;
    }
    pdVar6 = Curl_dynhds_getn(&req->headers,n);
    pcVar7 = pdVar6->name;
    uVar2 = pdVar6->namelen;
    for (lVar10 = 8;
        (lVar10 != 0x68 &&
        (uVar3 = *(ulong *)((long)&H2_NON_FIELD[0].name + lVar10), uVar3 <= uVar2));
        lVar10 = lVar10 + 0x10) {
      if ((uVar3 == uVar2) &&
         (iVar5 = curl_strequal(*(char **)((long)&cr_exp100.creader_size + lVar10),pcVar7),
         iVar5 != 0)) {
        CVar4 = CURLE_OK;
        goto LAB_00134fd2;
      }
    }
    CVar4 = Curl_dynhds_add(h2_headers,pdVar6->name,pdVar6->namelen,pdVar6->value,pdVar6->valuelen);
LAB_00134fd2:
    n = n + 1;
  } while( true );
}

Assistant:

CURLcode Curl_http_req_to_h2(struct dynhds *h2_headers,
                             struct httpreq *req, struct Curl_easy *data)
{
  const char *scheme = NULL, *authority = NULL;
  struct dynhds_entry *e;
  size_t i;
  CURLcode result;

  DEBUGASSERT(req);
  DEBUGASSERT(h2_headers);

  if(req->scheme) {
    scheme = req->scheme;
  }
  else if(strcmp("CONNECT", req->method)) {
    scheme = Curl_checkheaders(data, STRCONST(HTTP_PSEUDO_SCHEME));
    if(scheme) {
      scheme += sizeof(HTTP_PSEUDO_SCHEME);
      while(*scheme && ISBLANK(*scheme))
        scheme++;
      infof(data, "set pseudo header %s to %s", HTTP_PSEUDO_SCHEME, scheme);
    }
    else {
      scheme = (data->conn && data->conn->handler->flags & PROTOPT_SSL) ?
        "https" : "http";
    }
  }

  if(req->authority) {
    authority = req->authority;
  }
  else {
    e = Curl_dynhds_get(&req->headers, STRCONST("Host"));
    if(e)
      authority = e->value;
  }

  Curl_dynhds_reset(h2_headers);
  Curl_dynhds_set_opts(h2_headers, DYNHDS_OPT_LOWERCASE);
  result = Curl_dynhds_add(h2_headers, STRCONST(HTTP_PSEUDO_METHOD),
                           req->method, strlen(req->method));
  if(!result && scheme) {
    result = Curl_dynhds_add(h2_headers, STRCONST(HTTP_PSEUDO_SCHEME),
                             scheme, strlen(scheme));
  }
  if(!result && authority) {
    result = Curl_dynhds_add(h2_headers, STRCONST(HTTP_PSEUDO_AUTHORITY),
                             authority, strlen(authority));
  }
  if(!result && req->path) {
    result = Curl_dynhds_add(h2_headers, STRCONST(HTTP_PSEUDO_PATH),
                             req->path, strlen(req->path));
  }
  for(i = 0; !result && i < Curl_dynhds_count(&req->headers); ++i) {
    e = Curl_dynhds_getn(&req->headers, i);
    if(!h2_non_field(e->name, e->namelen)) {
      result = Curl_dynhds_add(h2_headers, e->name, e->namelen,
                               e->value, e->valuelen);
    }
  }

  return result;
}